

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_builder.h
# Opt level: O1

void BuilderReuseTests<TestHeapBuilder,_TestHeapBuilder>::run_tests(TestSelector *selector)

{
  _Rb_tree<BuilderReuseTestSelector,_BuilderReuseTestSelector,_std::_Identity<BuilderReuseTestSelector>,_std::less<BuilderReuseTestSelector>,_std::allocator<BuilderReuseTestSelector>_>
  local_d0;
  _Rb_tree<BuilderReuseTestSelector,_BuilderReuseTestSelector,_std::_Identity<BuilderReuseTestSelector>,_std::less<BuilderReuseTestSelector>,_std::allocator<BuilderReuseTestSelector>_>
  local_a0;
  _Rb_tree<BuilderReuseTestSelector,_BuilderReuseTestSelector,_std::_Identity<BuilderReuseTestSelector>,_std::less<BuilderReuseTestSelector>,_std::allocator<BuilderReuseTestSelector>_>
  local_70;
  _Rb_tree<BuilderReuseTestSelector,_BuilderReuseTestSelector,_std::_Identity<BuilderReuseTestSelector>,_std::less<BuilderReuseTestSelector>,_std::allocator<BuilderReuseTestSelector>_>
  local_40;
  
  std::
  _Rb_tree<BuilderReuseTestSelector,_BuilderReuseTestSelector,_std::_Identity<BuilderReuseTestSelector>,_std::less<BuilderReuseTestSelector>,_std::allocator<BuilderReuseTestSelector>_>
  ::_Rb_tree(&local_40,&selector->_M_t);
  builder_reusable_after_release_test((TestSelector *)&local_40);
  std::
  _Rb_tree<BuilderReuseTestSelector,_BuilderReuseTestSelector,_std::_Identity<BuilderReuseTestSelector>,_std::less<BuilderReuseTestSelector>,_std::allocator<BuilderReuseTestSelector>_>
  ::~_Rb_tree(&local_40);
  std::
  _Rb_tree<BuilderReuseTestSelector,_BuilderReuseTestSelector,_std::_Identity<BuilderReuseTestSelector>,_std::less<BuilderReuseTestSelector>,_std::allocator<BuilderReuseTestSelector>_>
  ::_Rb_tree(&local_70,&selector->_M_t);
  builder_reusable_after_releaseraw_test((TestSelector *)&local_70);
  std::
  _Rb_tree<BuilderReuseTestSelector,_BuilderReuseTestSelector,_std::_Identity<BuilderReuseTestSelector>,_std::less<BuilderReuseTestSelector>,_std::allocator<BuilderReuseTestSelector>_>
  ::~_Rb_tree(&local_70);
  std::
  _Rb_tree<BuilderReuseTestSelector,_BuilderReuseTestSelector,_std::_Identity<BuilderReuseTestSelector>,_std::less<BuilderReuseTestSelector>,_std::allocator<BuilderReuseTestSelector>_>
  ::_Rb_tree(&local_a0,&selector->_M_t);
  builder_reusable_after_release_and_move_assign_test((TestSelector *)&local_a0);
  std::
  _Rb_tree<BuilderReuseTestSelector,_BuilderReuseTestSelector,_std::_Identity<BuilderReuseTestSelector>,_std::less<BuilderReuseTestSelector>,_std::allocator<BuilderReuseTestSelector>_>
  ::~_Rb_tree(&local_a0);
  std::
  _Rb_tree<BuilderReuseTestSelector,_BuilderReuseTestSelector,_std::_Identity<BuilderReuseTestSelector>,_std::less<BuilderReuseTestSelector>,_std::allocator<BuilderReuseTestSelector>_>
  ::_Rb_tree(&local_d0,&selector->_M_t);
  builder_reusable_after_releaseraw_and_move_assign_test((TestSelector *)&local_d0);
  std::
  _Rb_tree<BuilderReuseTestSelector,_BuilderReuseTestSelector,_std::_Identity<BuilderReuseTestSelector>,_std::less<BuilderReuseTestSelector>,_std::allocator<BuilderReuseTestSelector>_>
  ::~_Rb_tree(&local_d0);
  return;
}

Assistant:

static void run_tests(TestSelector selector) {
    builder_reusable_after_release_test(selector);
    builder_reusable_after_releaseraw_test(selector);
    builder_reusable_after_release_and_move_assign_test(selector);
    builder_reusable_after_releaseraw_and_move_assign_test(selector);
  }